

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  int iVar1;
  IncorrectConstruction *__return_storage_ptr__;
  string local_38;
  MultiOptionPolicy local_14;
  Option *pOStack_10;
  MultiOptionPolicy value_local;
  Option *this_local;
  
  local_14 = value;
  pOStack_10 = this;
  iVar1 = get_items_expected(this);
  if (iVar1 < 0) {
    __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    get_name_abi_cxx11_(&local_38,this,false,false);
    IncorrectConstruction::MultiOptionPolicy(__return_storage_ptr__,&local_38);
    __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,
                IncorrectConstruction::~IncorrectConstruction);
  }
  (this->super_OptionBase<CLI::Option>).multi_option_policy_ = local_14;
  return this;
}

Assistant:

Option *multi_option_policy(MultiOptionPolicy value = MultiOptionPolicy::Throw) {

        if(get_items_expected() < 0)
            throw IncorrectConstruction::MultiOptionPolicy(get_name());
        multi_option_policy_ = value;
        return this;
    }